

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::TSPI_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,TSPI_PDU *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  byte bVar3;
  ostream *poVar4;
  pointer pcVar5;
  KFLOAT32 KVar6;
  KStringStream ss;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1b0 [16];
  long local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  LE_Header::GetAsString_abi_cxx11_(&local_1f0,&this->super_LE_Header);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,
                      (char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,
                                       (char)local_1f0._M_dataplus._M_p),local_1f0._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"-Time Space Position Information(TSPI) PDU-\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Optional Field Flags:\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tLinear Velocity:          ",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tLinear Orientation:       ",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tPosition Error:           ",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tOrientation Error:        ",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tDead Reckoning Parameter: ",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tMeasured Speed:           ",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tSystem Specific Data:     ",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Location - ",0xb);
  DATA_TYPE::RelativeWorldCoordinates::GetAsString_abi_cxx11_(&local_1d0,&this->m_Loc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_1f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p),
                    local_1f0.field_2._M_allocated_capacity + 1);
  }
  bVar3 = (this->m_TSPIFlagUnion).m_ui8Flag;
  if ((bVar3 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Linear Velocity:          ",0x1a);
    DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
              (&local_1f0,&this->m_LinVel);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               (char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p),
               local_1f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar3 & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Linear Orientation:       ",0x1a);
    DATA_TYPE::LE_EulerAngles::GetAsString_abi_cxx11_(&local_1f0,&this->m_Ori);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               (char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p),
               local_1f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar3 & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Position Error:           ",0x1a);
    DATA_TYPE::PositionError::GetAsString_abi_cxx11_(&local_1f0,&this->m_PosErr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               (char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p),
               local_1f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar3 & 8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Orientation Error:        ",0x1a);
    DATA_TYPE::OrientationError::GetAsString_abi_cxx11_(&local_1f0,&this->m_OriErr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               (char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p),
               local_1f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar3 & 0x10) != 0) {
    DATA_TYPE::LE_DeadReckoningParameter::GetAsString_abi_cxx11_
              (&local_1f0,&this->m_DeadReckoningParameter);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               (char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p),
               local_1f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f0._M_dataplus._M_p._1_7_,(char)local_1f0._M_dataplus._M_p),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar3 & 0x20) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Measured Speed:           ",0x1a);
    KVar6 = DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_MeasureSpd);
    std::ostream::_M_insert<double>((double)(float)KVar6);
    bVar3 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar3 & 0x40) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"System Specific Data:\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\tData Length: ",0xe);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tData: ",7);
    pcVar5 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar5 != pcVar2) {
      do {
        *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
             *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
        local_1f0._M_dataplus._M_p._0_1_ = *pcVar5;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,(char *)&local_1f0,1);
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 != pcVar2);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

KString TSPI_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-Time Space Position Information(TSPI) PDU-\n"
       << "Optional Field Flags:\n"
       << "\tLinear Velocity:          " << ( KUINT16 )m_TSPIFlagUnion.m_ui8LinVel << "\n"
       << "\tLinear Orientation:       " << ( KUINT16 )m_TSPIFlagUnion.m_ui8Ori    << "\n"
       << "\tPosition Error:           " << ( KUINT16 )m_TSPIFlagUnion.m_ui8PosErr << "\n"
       << "\tOrientation Error:        " << ( KUINT16 )m_TSPIFlagUnion.m_ui8OriErr << "\n"
       << "\tDead Reckoning Parameter: " << ( KUINT16 )m_TSPIFlagUnion.m_ui8DRM    << "\n"
       << "\tMeasured Speed:           " << ( KUINT16 )m_TSPIFlagUnion.m_ui8Spd    << "\n"
       << "\tSystem Specific Data:     " << ( KUINT16 )m_TSPIFlagUnion.m_ui8Data   << "\n"
       << "Location - "                << m_Loc.GetAsString();

    if( m_TSPIFlagUnion.m_ui8LinVel )
    {
        ss << "Linear Velocity:          " << m_LinVel.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8Ori )
    {
        ss << "Linear Orientation:       " << m_Ori.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8PosErr )
    {
        ss << "Position Error:           " << m_PosErr.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8OriErr )
    {
        ss << "Orientation Error:        " << m_OriErr.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8DRM )
    {
        ss << m_DeadReckoningParameter.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8Spd )
    {
        ss << "Measured Speed:           " << m_MeasureSpd.GetAsFloat32();
    }

    if( m_TSPIFlagUnion.m_ui8Data )
    {
        ss  << "System Specific Data:\n"
            << "\tData Length: "    << ( KUINT16 )m_ui8SSDLen << "\n"
            << "\tData: ";

        vector<KOCTET>::const_iterator citr = m_vSSD.begin();
        vector<KOCTET>::const_iterator citrEnd = m_vSSD.end();
        for( ; citr != citrEnd; ++citr )
        {
            ss << hex << *citr;
        }
    }

    return ss.str();
}